

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O1

int32_t ll_net_token_get(uint32_t *p_net_token)

{
  _Bool _Var1;
  int32_t iVar2;
  uint uVar3;
  bool bVar4;
  
  if (p_net_token == (uint32_t *)0x0) {
    iVar2 = -0x65;
  }
  else {
    _Var1 = transport_mutex_grab();
    iVar2 = -0x71;
    if (_Var1) {
      iVar2 = hal_read_write(OP_NET_TOKEN_GET,(uint8_t *)0x0,0,_ll_ifc_message_buff,4);
      transport_mutex_release();
      if ((-1 < iVar2) && (bVar4 = iVar2 == 4, iVar2 = -0x66, bVar4)) {
        *p_net_token = 0;
        uVar3 = _ll_ifc_message_buff._0_4_ << 0x18;
        *p_net_token = uVar3;
        uVar3 = ((uint)_ll_ifc_message_buff._0_4_ >> 8 & 0xff) << 0x10 | uVar3;
        *p_net_token = uVar3;
        uVar3 = ((uint)_ll_ifc_message_buff._0_4_ >> 0x10 & 0xff) << 8 | uVar3;
        *p_net_token = uVar3;
        *p_net_token = (uint)_ll_ifc_message_buff._0_4_ >> 0x18 | uVar3;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t ll_net_token_get(uint32_t *p_net_token)
{
    if (p_net_token == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    int32_t ret = hal_read_write(OP_NET_TOKEN_GET, NULL, 0, &_ll_ifc_message_buff[0], 4);
    transport_mutex_release();

    if (ret < 0)
    {
        return ret;
    }

    if (4 != ret)
    {
        return LL_IFC_ERROR_INCORRECT_RESPONSE_LENGTH;
    }

    *p_net_token = 0;
    *p_net_token |= (uint32_t) _ll_ifc_message_buff[0] << 24;
    *p_net_token |= (uint32_t) _ll_ifc_message_buff[1] << 16;
    *p_net_token |= (uint32_t) _ll_ifc_message_buff[2] << 8;
    *p_net_token |= (uint32_t) _ll_ifc_message_buff[3];
    return LL_IFC_ACK;
}